

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_gtest_utils.hpp
# Opt level: O0

void unodb::test::QSBRTestBase::qsbr_deallocate(void *ptr)

{
  size_t pointer;
  bool bVar1;
  qsbr_per_thread *pqVar2;
  qsbr *this;
  type word;
  char *pcVar3;
  char *in_R9;
  bool local_1f1;
  bool local_1e1;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__1;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_3;
  bool single_thread_mode;
  size_t sStack_c0;
  bool current_interval_empty_after;
  size_t current_interval_total_dealloc_size_after;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t current_interval_total_dealloc_size_after_1;
  bool current_interval_empty_after_1;
  bool previous_interval_empty_after;
  debug_callback local_40;
  undefined1 local_1a;
  undefined1 local_19;
  bool current_interval_empty_before;
  size_t sStack_18;
  bool previous_interval_empty_before;
  size_t current_interval_total_dealloc_size_before;
  void *ptr_local;
  
  current_interval_total_dealloc_size_before = (size_t)ptr;
  pqVar2 = this_thread();
  sStack_18 = qsbr_per_thread::get_current_interval_total_dealloc_size(pqVar2);
  pqVar2 = this_thread();
  local_19 = qsbr_per_thread::previous_interval_requests_empty(pqVar2);
  pqVar2 = this_thread();
  local_1a = qsbr_per_thread::current_interval_requests_empty(pqVar2);
  pqVar2 = this_thread();
  pointer = current_interval_total_dealloc_size_before;
  std::function<void(void_const*)>::function<void(&)(void_const*)noexcept,void>
            ((function<void(void_const*)> *)&local_40,check_ptr_on_qsbr_dealloc);
  qsbr_per_thread::on_next_epoch_deallocate(pqVar2,(void *)pointer,1,&local_40);
  std::function<void_(const_void_*)>::~function(&local_40);
  pqVar2 = this_thread();
  sStack_c0 = qsbr_per_thread::get_current_interval_total_dealloc_size(pqVar2);
  pqVar2 = this_thread();
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = qsbr_per_thread::current_interval_requests_empty(pqVar2);
  this = qsbr::instance();
  word = qsbr::get_state(this);
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = qsbr_state::single_thread_mode(word);
  local_d9 = sStack_c0 == 0;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_d8,"(current_interval_empty_after)",
             "((current_interval_total_dealloc_size_after == 0))",
             (bool *)((long)&gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7),&local_d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  if ((gtest_ar_3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._6_1_ & 1) == 0) {
    local_14c = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)local_148,"(current_interval_total_dealloc_size_after)","(0)",
               &stack0xffffffffffffff40,&local_14c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
                 ,0xd9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    local_1f1 = sStack_c0 == 1 || sStack_c0 == sStack_18 + 1;
    local_171 = local_1f1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_170,&local_171,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1a8,(internal *)local_170,
                 (AssertionResult *)
                 "current_interval_total_dealloc_size_after == 1 || (current_interval_total_dealloc_size_after == current_interval_total_dealloc_size_before + 1)"
                 ,"false","true",in_R9);
      pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&local_1a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
                 ,0xdc,pcVar3);
      testing::internal::AssertHelper::operator=(&local_188,&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      testing::Message::~Message(&local_180);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  }
  else {
    local_1e1 = sStack_18 == sStack_c0 || sStack_c0 == 0;
    local_101 = local_1e1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_100,&local_101,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_4.message_,(internal *)local_100,
                 (AssertionResult *)
                 "current_interval_total_dealloc_size_before == current_interval_total_dealloc_size_after || current_interval_total_dealloc_size_after == 0"
                 ,"false","true",in_R9);
      pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gtest_ar_4.message_);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
                 ,0xd7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  }
  return;
}

Assistant:

static void qsbr_deallocate(void *ptr) {
#ifdef UNODB_DETAIL_WITH_STATS
    const auto current_interval_total_dealloc_size_before =
        unodb::this_thread().get_current_interval_total_dealloc_size();
#endif  // UNODB_DETAIL_WITH_STATS
    const auto previous_interval_empty_before =
        unodb::this_thread().previous_interval_requests_empty();
    const auto current_interval_empty_before =
        unodb::this_thread().current_interval_requests_empty();

    try {
      unodb::this_thread().on_next_epoch_deallocate(ptr
#ifdef UNODB_DETAIL_WITH_STATS
                                                    ,
                                                    1
#endif
#ifndef NDEBUG
                                                    ,
                                                    check_ptr_on_qsbr_dealloc
#endif
      );
    } catch (...) {
      const auto previous_interval_empty_after =
          unodb::this_thread().previous_interval_requests_empty();
      const auto current_interval_empty_after =
          unodb::this_thread().current_interval_requests_empty();
#ifdef UNODB_DETAIL_WITH_STATS
      const auto current_interval_total_dealloc_size_after =
          unodb::this_thread().get_current_interval_total_dealloc_size();
      UNODB_EXPECT_EQ(current_interval_total_dealloc_size_before,
                      current_interval_total_dealloc_size_after);
#endif  // UNODB_DETAIL_WITH_STATS
      UNODB_EXPECT_EQ(previous_interval_empty_before,
                      previous_interval_empty_after);
      UNODB_EXPECT_EQ(current_interval_empty_before,
                      current_interval_empty_after);
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto current_interval_total_dealloc_size_after =
        unodb::this_thread().get_current_interval_total_dealloc_size();
    const auto current_interval_empty_after =
        unodb::this_thread().current_interval_requests_empty();
    const auto single_thread_mode =
        qsbr_state::single_thread_mode(qsbr::instance().get_state());
    UNODB_EXPECT_EQ(current_interval_empty_after,
                    (current_interval_total_dealloc_size_after == 0));
    if (single_thread_mode) {
      UNODB_EXPECT_TRUE(current_interval_total_dealloc_size_before ==
                            current_interval_total_dealloc_size_after ||
                        current_interval_total_dealloc_size_after == 0);
    } else {
      UNODB_EXPECT_GT(current_interval_total_dealloc_size_after, 0);
      UNODB_EXPECT_TRUE(current_interval_total_dealloc_size_after == 1 ||
                        (current_interval_total_dealloc_size_after ==
                         current_interval_total_dealloc_size_before + 1));
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }